

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O2

scope scope_create(char *name)

{
  int iVar1;
  scope __ptr;
  size_t sVar2;
  char *pcVar3;
  set psVar4;
  vector pvVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  
  if (name == (char *)0x0) {
    pcVar3 = "Scope create invalid parameters";
    uVar7 = 0xa4;
  }
  else {
    __ptr = (scope)malloc(0x18);
    if (__ptr != (scope)0x0) {
      sVar2 = strlen(name);
      pcVar3 = (char *)malloc(sVar2 + 1);
      __ptr->name = pcVar3;
      if (pcVar3 == (char *)0x0) {
        log_write_impl_va("metacall",0x5b,"scope_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                          ,3,"Scope create name bad allocation");
      }
      else {
        memcpy(pcVar3,name,sVar2 + 1);
        psVar4 = (set)set_create(hash_callback_str,comparable_callback_str);
        __ptr->objects = psVar4;
        if (psVar4 == (set)0x0) {
          log_write_impl_va("metacall",0x68,"scope_create",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                            ,3,"Scope create map bad allocation");
        }
        else {
          pvVar5 = (vector)vector_create(1);
          __ptr->call_stack = pvVar5;
          if (pvVar5 == (vector)0x0) {
            log_write_impl_va("metacall",0x75,"scope_create",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                              ,3,"Scope create call stack bad allocation");
          }
          else {
            iVar1 = vector_resize(pvVar5,8);
            if (iVar1 == 0) {
              puVar6 = (undefined8 *)vector_front(pvVar5);
              if (puVar6 != (undefined8 *)0x0) {
                *puVar6 = 0;
                return __ptr;
              }
              pcVar3 = "Scope create bad call stack head reference";
              uVar7 = 0x9a;
              goto LAB_00108f62;
            }
            log_write_impl_va("metacall",0x82,"scope_create",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                              ,3,"Scope create call stack bad allocation");
            vector_destroy(pvVar5);
          }
          set_destroy(psVar4);
        }
        free(pcVar3);
      }
      free(__ptr);
      return (scope)0x0;
    }
    pcVar3 = "Scope create bad allocation";
    uVar7 = 0x9f;
  }
LAB_00108f62:
  log_write_impl_va("metacall",uVar7,"scope_create",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                    ,3,pcVar3);
  return (scope)0x0;
}

Assistant:

scope scope_create(const char *name)
{
	if (name != NULL)
	{
		scope sp = malloc(sizeof(struct scope_type));

		if (sp != NULL)
		{
			size_t sp_name_size = strlen(name) + 1;

			size_t *call_stack_head = NULL;

			sp->name = malloc(sizeof(char) * sp_name_size);

			if (sp->name == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create name bad allocation");

				free(sp);

				return NULL;
			}

			memcpy(sp->name, name, sp_name_size);

			sp->objects = set_create(&hash_callback_str, &comparable_callback_str);

			if (sp->objects == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create map bad allocation");

				free(sp->name);

				free(sp);

				return NULL;
			}

			sp->call_stack = vector_create(sizeof(char));

			if (sp->call_stack == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create call stack bad allocation");

				set_destroy(sp->objects);

				free(sp->name);

				free(sp);

				return NULL;
			}

			if (vector_resize(sp->call_stack, sizeof(size_t)) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create call stack bad allocation");

				vector_destroy(sp->call_stack);

				set_destroy(sp->objects);

				free(sp->name);

				free(sp);

				return NULL;
			}

			call_stack_head = vector_front(sp->call_stack);

			if (call_stack_head != NULL)
			{
				const size_t head_index = 0;

				memcpy(call_stack_head, &head_index, sizeof(size_t));

				return sp;
			}

			log_write("metacall", LOG_LEVEL_ERROR, "Scope create bad call stack head reference");

			return NULL;
		}

		log_write("metacall", LOG_LEVEL_ERROR, "Scope create bad allocation");

		return NULL;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Scope create invalid parameters");

	return NULL;
}